

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

int __thiscall tetgenmesh::removeedgebyflips(tetgenmesh *this,triface *flipedge,flipconstraints *fc)

{
  int iVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  triface *local_a0;
  int bakunflip;
  face *local_68;
  face *paryseg;
  face checkseg;
  int i;
  int nn;
  int n;
  int t1ver;
  triface spintet;
  triface *abtets;
  flipconstraints *fc_local;
  triface *flipedge_local;
  tetgenmesh *this_local;
  
  triface::triface((triface *)&n);
  if (((this->checksubsegflag == 0) || (flipedge->tet[8] == (tetrahedron)0x0)) ||
     (flipedge->tet[8][ver2edge[flipedge->ver]] == (double *)0x0)) {
    i = 0;
    triface::operator=((triface *)&n,flipedge);
    do {
      iVar1 = (int)spintet.tet;
      i = i + 1;
      decode(this,_n[facepivot1[(int)spintet.tet]],(triface *)&n);
      spintet.tet._0_4_ = facepivot2[iVar1][(int)spintet.tet];
    } while (_n != flipedge->tet);
    if (i < 3) {
      terminatetetgen(this,2);
    }
    if ((this->b->flipstarsize < 1) || (i <= this->b->flipstarsize)) {
      uVar4 = (ulong)i;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar4;
      uVar5 = SUB168(auVar2 * ZEXT816(0x10),0);
      if (SUB168(auVar2 * ZEXT816(0x10),8) != 0) {
        uVar5 = 0xffffffffffffffff;
      }
      spintet._8_8_ = operator_new__(uVar5);
      if (uVar4 != 0) {
        local_a0 = (triface *)spintet._8_8_;
        do {
          triface::triface(local_a0);
          local_a0 = local_a0 + 1;
        } while (local_a0 != (triface *)(spintet._8_8_ + uVar4 * 0x10));
      }
      triface::operator=((triface *)&n,flipedge);
      checkseg.shver = 0;
      do {
        triface::operator=((triface *)(spintet._8_8_ + (long)checkseg.shver * 0x10),(triface *)&n);
        setelemcounter(this,(triface *)(spintet._8_8_ + (long)checkseg.shver * 0x10),1);
        iVar1 = (int)spintet.tet;
        checkseg.shver = checkseg.shver + 1;
        decode(this,_n[facepivot1[(int)spintet.tet]],(triface *)&n);
        spintet.tet._0_4_ = facepivot2[iVar1][(int)spintet.tet];
      } while (_n != flipedge->tet);
      checkseg._12_4_ = flipnm(this,(triface *)spintet._8_8_,i,0,0,fc);
      if (2 < (int)checkseg._12_4_) {
        for (checkseg.shver = 0; checkseg.shver < (int)checkseg._12_4_;
            checkseg.shver = checkseg.shver + 1) {
          setelemcounter(this,(triface *)(spintet._8_8_ + (long)checkseg.shver * 0x10),0);
        }
        triface::operator=(flipedge,(triface *)spintet._8_8_);
      }
      iVar1 = fc->unflip;
      fc->unflip = 0;
      flipnm_post(this,(triface *)spintet._8_8_,i,checkseg._12_4_,0,fc);
      fc->unflip = iVar1;
      if (spintet._8_8_ != 0) {
        operator_delete__((void *)spintet._8_8_);
      }
      this_local._4_4_ = checkseg._12_4_;
    }
    else {
      this_local._4_4_ = 0;
    }
  }
  else {
    if (fc->collectencsegflag != 0) {
      face::face((face *)&paryseg);
      tsspivot1(this,flipedge,(face *)&paryseg);
      bVar3 = sinfected(this,(face *)&paryseg);
      if (!bVar3) {
        sinfect(this,(face *)&paryseg);
        arraypool::newindex(this->caveencseglist,&local_68);
        face::operator=(local_68,(face *)&paryseg);
      }
    }
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int tetgenmesh::removeedgebyflips(triface *flipedge, flipconstraints* fc)
{
  triface *abtets, spintet;
  int t1ver; 
  int n, nn, i;


  if (checksubsegflag) {
    // Do not flip a segment.
    if (issubseg(*flipedge)) {
      if (fc->collectencsegflag) {
        face checkseg, *paryseg;
        tsspivot1(*flipedge, checkseg);
        if (!sinfected(checkseg)) {
          // Queue this segment in list.
          sinfect(checkseg);                
          caveencseglist->newindex((void **) &paryseg);
          *paryseg = checkseg;
        }
      }
      return 0;
    }
  }

  // Count the number of tets at edge [a,b].
  n = 0;
  spintet = *flipedge;
  while (1) {
    n++;
    fnextself(spintet);
    if (spintet.tet == flipedge->tet) break;
  }
  if (n < 3) {
    // It is only possible when the mesh contains inverted tetrahedra.  
    terminatetetgen(this, 2); // Report a bug
  }

  if ((b->flipstarsize > 0) && (n > b->flipstarsize)) {
    // The star size exceeds the limit.
    return 0; // Do not flip it.
  }

  // Allocate spaces.
  abtets = new triface[n];
  // Collect the tets at edge [a,b].
  spintet = *flipedge;
  i = 0;
  while (1) {
    abtets[i] = spintet;
    setelemcounter(abtets[i], 1); 
    i++;
    fnextself(spintet);
    if (spintet.tet == flipedge->tet) break;
  }


  // Try to flip the edge (level = 0, edgepivot = 0).
  nn = flipnm(abtets, n, 0, 0, fc);


  if (nn > 2) {
    // Edge is not flipped. Unmarktest the remaining tets in Star(ab).
    for (i = 0; i < nn; i++) {
      setelemcounter(abtets[i], 0);
    }
    // Restore the input edge (needed by Lawson's flip).
    *flipedge = abtets[0];
  }

  // Release the temporary allocated spaces.
  // NOTE: fc->unflip must be 0.
  int bakunflip = fc->unflip;
  fc->unflip = 0;
  flipnm_post(abtets, n, nn, 0, fc);
  fc->unflip = bakunflip;

  delete [] abtets;

  return nn; 
}